

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenFunctionRunPasses
               (BinaryenFunctionRef func,BinaryenModuleRef module,char **passes,
               BinaryenIndex numPasses)

{
  pointer pcVar1;
  char **ppcVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  long lVar5;
  ulong uVar6;
  PassOptions *pPVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  undefined1 local_1c8 [120];
  __node_base_ptr *local_150;
  size_type local_148;
  __node_base local_140;
  size_type sStack_138;
  float local_130;
  size_t local_128;
  __node_base_ptr p_Stack_120;
  __node_base_ptr *local_118;
  size_type local_110;
  __node_base local_108;
  size_type sStack_100;
  float local_f8;
  size_t local_f0;
  __node_base_ptr p_Stack_e8;
  undefined2 local_e0;
  key_type local_d8;
  key_type local_b8;
  string local_98;
  char **local_78;
  ulong local_70;
  BinaryenFunctionRef local_68;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_60;
  bool local_40;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_1c8._0_8_ = &PTR__PassRunner_010714e0;
  local_1c8._16_8_ = &module->allocator;
  local_1c8._24_8_ = (pointer)0x0;
  local_1c8._32_8_ = (pointer)0x0;
  local_1c8._40_8_ = (pointer)0x0;
  local_150 = &p_Stack_120;
  local_148 = 1;
  local_140._M_nxt = (_Hash_node_base *)0x0;
  sStack_138 = 0;
  local_130 = 1.0;
  local_128 = 0;
  p_Stack_120 = (__node_base_ptr)0x0;
  local_118 = &p_Stack_e8;
  local_110 = 1;
  local_108._M_nxt = (_Hash_node_base *)0x0;
  sStack_100 = 0;
  local_f8 = 1.0;
  local_f0 = 0;
  p_Stack_e8 = (__node_base_ptr)0x0;
  local_e0._0_1_ = false;
  local_e0._1_1_ = false;
  pPVar7 = &globalPassOptions;
  puVar9 = (undefined8 *)(local_1c8 + 0x30);
  local_78 = passes;
  local_68 = func;
  for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = *(undefined8 *)pPVar7;
    pPVar7 = (PassOptions *)&pPVar7->shrinkLevel;
    puVar9 = puVar9 + 1;
  }
  local_1c8[0x70] = globalPassOptions.targetJS;
  local_1c8._8_8_ = module;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_150,&globalPassOptions.arguments._M_h);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_118,&globalPassOptions.passesToSkip._M_h);
  if (numPasses != 0) {
    local_70 = (ulong)numPasses;
    uVar6 = 0;
    do {
      ppcVar2 = local_78;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_78[uVar6],&local_33);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,ppcVar2[uVar6],&local_32);
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&globalPassOptions.arguments._M_h,&local_d8);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,ppcVar2[uVar6],&local_31);
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&globalPassOptions.arguments,&local_b8);
        local_60._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_60._M_value + 0x10);
        pcVar1 = (pmVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar1,pcVar1 + pmVar4->_M_string_length);
      }
      local_40 = cVar3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0;
      wasm::PassRunner::add
                ((PassRunner *)local_1c8,&local_98,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        if ((local_40 != false) &&
           (local_40 = false, uVar8 = local_60._16_8_, uVar10 = local_60._M_value._M_dataplus._M_p,
           local_60._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_60._M_value + 0x10)))
        goto LAB_00cfcba6;
      }
      else {
        if ((local_40 != false) &&
           (local_40 = false,
           local_60._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_60._M_value + 0x10))) {
          operator_delete((void *)local_60._M_value._M_dataplus._M_p,local_60._16_8_ + 1);
        }
        uVar8 = local_b8.field_2._M_allocated_capacity;
        uVar10 = local_b8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00cfcba6:
          operator_delete((void *)uVar10,uVar8 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
    } while (local_70 != uVar6);
  }
  wasm::PassRunner::runOnFunction((PassRunner *)local_1c8,local_68);
  wasm::PassRunner::~PassRunner((PassRunner *)local_1c8);
  return;
}

Assistant:

void BinaryenFunctionRunPasses(BinaryenFunctionRef func,
                               BinaryenModuleRef module,
                               const char** passes,
                               BinaryenIndex numPasses) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  for (BinaryenIndex i = 0; i < numPasses; i++) {
    passRunner.add(passes[i],
                   globalPassOptions.arguments.count(passes[i]) > 0
                     ? globalPassOptions.arguments[passes[i]]
                     : std::optional<std::string>());
  }
  passRunner.runOnFunction((Function*)func);
}